

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::XThreadPaf::FulfillScope::FulfillScope(FulfillScope *this,XThreadPaf **pointer)

{
  XThreadPaf *pXVar1;
  bool bVar2;
  anon_enum_32 oldState;
  Fault f;
  DebugComparison<kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)_&,_kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)>
  _kjCondition;
  anon_enum_32 local_3c;
  Fault local_38;
  DebugComparison<kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)_&,_kj::_::XThreadPaf::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:2026:3)>
  local_30;
  
  LOCK();
  pXVar1 = *pointer;
  *pointer = (XThreadPaf *)0x0;
  UNLOCK();
  this->obj = pXVar1;
  if (pXVar1 != (XThreadPaf *)0x0) {
    LOCK();
    local_3c = pXVar1->state;
    bVar2 = local_3c == WAITING;
    if (bVar2) {
      pXVar1->state = FULFILLING;
      local_3c = WAITING;
    }
    UNLOCK();
    if (!bVar2) {
      local_30.left = &local_3c;
      local_30.right = CANCELED;
      local_30.op.content.ptr = " == ";
      local_30.op.content.size_ = 5;
      local_30.result = local_3c == CANCELED;
      if (!local_30.result) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadPaf::_unnamed_type_1_&,_unnamed_type_1_>&>
                  (&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x4c7,FAILED,"oldState == CANCELED","_kjCondition,",&local_30);
        Debug::Fault::fatal(&local_38);
      }
      if (this->obj != (XThreadPaf *)0x0) {
        (*(this->obj->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])();
      }
      this->obj = (XThreadPaf *)0x0;
    }
  }
  return;
}

Assistant:

XThreadPaf::FulfillScope::FulfillScope(XThreadPaf** pointer) {
  obj = __atomic_exchange_n(pointer, static_cast<XThreadPaf*>(nullptr), __ATOMIC_ACQUIRE);
  auto oldState = WAITING;
  if (obj == nullptr) {
    // Already fulfilled (possibly by another thread).
  } else if (__atomic_compare_exchange_n(&obj->state, &oldState, FULFILLING, false,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
    // Transitioned to FULFILLING, good.
  } else {
    // The waiting thread must have canceled.
    KJ_ASSERT(oldState == CANCELED);

    // It's our responsibility to clean up, then.
    delete obj;

    // Set `obj` null so that we don't try to fill it in or delete it later.
    obj = nullptr;
  }
}